

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_constants_o_melee_critical(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  void *pvVar3;
  char *__s1;
  
  pvVar3 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar1 = parser_getint(p,"value");
  iVar2 = strcmp(__s1,"debuff-toh");
  if (iVar2 == 0) {
    *(wchar_t *)((long)pvVar3 + 0xf8) = wVar1;
  }
  else {
    iVar2 = strcmp(__s1,"power-toh-scale-numerator");
    if (iVar2 == 0) {
      *(wchar_t *)((long)pvVar3 + 0xfc) = wVar1;
    }
    else {
      iVar2 = strcmp(__s1,"power-toh-scale-denominator");
      if (iVar2 == 0) {
        *(wchar_t *)((long)pvVar3 + 0x100) = wVar1;
      }
      else {
        iVar2 = strcmp(__s1,"chance-power-scale-numerator");
        if (iVar2 == 0) {
          *(wchar_t *)((long)pvVar3 + 0x104) = wVar1;
        }
        else {
          iVar2 = strcmp(__s1,"chance-power-scale-denominator");
          if (iVar2 == 0) {
            *(wchar_t *)((long)pvVar3 + 0x108) = wVar1;
          }
          else {
            iVar2 = strcmp(__s1,"chance-add-denominator");
            if (iVar2 != 0) {
              return PARSE_ERROR_UNDEFINED_DIRECTIVE;
            }
            *(wchar_t *)((long)pvVar3 + 0x10c) = wVar1;
          }
        }
      }
    }
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_constants_o_melee_critical(struct parser *p)
{
	struct angband_constants *z = parser_priv(p);
	const char *label = parser_getsym(p, "label");
	int value = parser_getint(p, "value");

	if (streq(label, "debuff-toh")) {
		z->o_m_crit_debuff_toh = value;
	} else if (streq(label, "power-toh-scale-numerator")) {
		z->o_m_crit_power_toh_scl_num = value;
	} else if (streq(label, "power-toh-scale-denominator")) {
		z->o_m_crit_power_toh_scl_den = value;
	} else if (streq(label, "chance-power-scale-numerator")) {
		z->o_m_crit_chance_power_scl_num = value;
	} else if (streq(label, "chance-power-scale-denominator")) {
		z->o_m_crit_chance_power_scl_den = value;
	} else if (streq(label, "chance-add-denominator")) {
		z->o_m_crit_chance_add_den = value;
	} else {
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;
	}

	return PARSE_ERROR_NONE;
}